

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  char *pcVar1;
  int iVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  string_view message_00;
  buffer<char> *buf;
  char *local_270;
  dispatcher local_268;
  undefined **local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char local_228 [504];
  
  message_00.data_ = (char **)message.size_;
  local_248 = &PTR_grow_008797a0;
  local_230 = (char *)0x1f4;
  local_238 = (char *)0x1f4;
  local_240 = local_228;
  do {
    local_268.error_code_ = error_code;
    local_270 = local_240;
    local_268.buffer_ = &local_270;
    local_268.buffer_size_ = (size_t)local_238;
    iVar2 = detail::anon_func::dispatcher::run(&local_268);
    if (iVar2 != 0x22) {
      if (iVar2 == 0) {
        in_R8.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_268;
        local_268.buffer_size_ = (size_t)local_270;
        format_str.size_ = 6;
        format_str.data_ = "{}: {}";
        args.field_1.values_ = in_R8.values_;
        args.desc_ = 0xcd;
        local_268._0_8_ = message.data_;
        local_268.buffer_ = message_00.data_;
        detail::vformat_to<char>(out,format_str,args,(locale_ref)0x0);
      }
      if (local_240 != local_228) {
        operator_delete(local_240,(ulong)local_230);
      }
      if (iVar2 != 0) {
        message_00.size_ = (size_t)in_R8.values_;
        detail::format_error_code
                  ((detail *)out,(buffer<char> *)(ulong)(uint)error_code,(int)message.data_,
                   message_00);
      }
      return;
    }
    pcVar1 = (char *)((long)local_238 * 2);
    if (local_230 < pcVar1) {
      (*(code *)*local_248)(&local_248,pcVar1);
    }
    local_238 = pcVar1;
    if (local_230 < pcVar1) {
      local_238 = local_230;
    }
    local_270 = local_240;
  } while ((local_240 != (char *)0x0) && (local_238 != (char *)0x0));
  detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                      ,0x47,"invalid buffer");
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }